

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

size_t unshield_file_size(Unshield *unshield,int index)

{
  FileDescriptor *pFVar1;
  uint64_t uVar2;
  
  pFVar1 = unshield_get_file_descriptor(unshield,index);
  if (pFVar1 == (FileDescriptor *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = pFVar1->expanded_size;
  }
  return uVar2;
}

Assistant:

size_t unshield_file_size(Unshield* unshield, int index)/*{{{*/
{
  FileDescriptor* fd = unshield_get_file_descriptor(unshield, index);
  if (fd)
  {
    return fd->expanded_size;
  }
  else
    return 0;
}